

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

double __thiscall calc::OperatorNode::eval(OperatorNode *this)

{
  logic_error *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  
  (**((this->left_).super___shared_ptr<calc::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node)
            ();
  (**((this->right_).super___shared_ptr<calc::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node)
            ();
  switch(this->type_) {
  case Plus:
    dVar1 = extraout_XMM0_Qa + extraout_XMM0_Qa_00;
    break;
  case Minus:
    dVar1 = extraout_XMM0_Qa - extraout_XMM0_Qa_00;
    break;
  case Prod:
    dVar1 = extraout_XMM0_Qa * extraout_XMM0_Qa_00;
    break;
  case Div:
    if ((extraout_XMM0_Qa_00 == 0.0) && (!NAN(extraout_XMM0_Qa_00))) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Zero division");
      goto LAB_00105bd5;
    }
    dVar1 = extraout_XMM0_Qa / extraout_XMM0_Qa_00;
    break;
  case LeftBracket:
  case RightBracket:
    dVar1 = 0.0;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown operator");
LAB_00105bd5:
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return dVar1;
}

Assistant:

double OperatorNode::eval() const
{
	const double left = left_->eval();
	const double right = right_->eval();
	switch (type_)
	{
	case calc::OperatorType::Plus:
		return left + right;
	case calc::OperatorType::Minus:
		return left - right;
	case calc::OperatorType::Prod:
		return left * right;
	case calc::OperatorType::Div:
		if (right == 0)
		{
			throw std::logic_error("Zero division");
		}
		return left / right;
	case calc::OperatorType::LeftBracket:
		return 0;
	case calc::OperatorType::RightBracket:
		return 0;
	default:
		throw std::logic_error("Unknown operator");
	}
}